

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

Mio_Cell_t * Mio_CollectRootsNew(Mio_Library_t *pLib,int nInputs,int *pnGates,int fVerbose)

{
  int *piVar1;
  byte *pbVar2;
  uint uVar3;
  word wVar4;
  int iVar5;
  int iVar6;
  Mio_Cell_t *pMVar7;
  Mio_Gate_t *pMVar8;
  Mio_Cell_t *pMVar9;
  float *pfVar10;
  Mio_Pin_t *pMVar11;
  uint *puVar12;
  void *__ptr;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  float *pfVar16;
  word *pwVar17;
  char *__s;
  uint uVar18;
  float fVar19;
  float fVar20;
  
  iVar5 = Mio_LibraryReadGateNum(pLib);
  pMVar7 = (Mio_Cell_t *)calloc((long)(iVar5 + 4),0x30);
  pMVar8 = Mio_LibraryReadGates(pLib);
  if (pMVar8 == (Mio_Gate_t *)0x0) {
    uVar18 = 4;
  }
  else {
    uVar18 = 4;
    do {
      uVar3 = uVar18;
      if ((pMVar8->nInputs <= nInputs) && (pMVar8->pTwin == (Mio_Gate_t *)0x0)) {
        if (0 < (int)uVar18) {
          uVar13 = 0;
          pfVar10 = pMVar7->Delays;
LAB_003dde26:
          if ((pMVar7[uVar13].pName == (char *)0x0) ||
             (pMVar9 = pMVar7 + uVar13, pMVar9->uTruth != (pMVar8->field_15).uTruth))
          goto LAB_003dde46;
          if ((float)pMVar8->dArea + 0.0094636 < pMVar9->Area) goto LAB_003ddfc9;
          if ((float)pMVar8->dArea + -0.0094636 <= pMVar9->Area) {
            uVar18 = *(uint *)&pMVar9->field_0x8;
            uVar13 = (ulong)(uVar18 >> 0x1c);
            fVar19 = 0.0;
            pfVar16 = pfVar10;
            if (0xfffffff < uVar18) {
              do {
                fVar19 = fVar19 + *pfVar16;
                uVar13 = uVar13 - 1;
                pfVar16 = pfVar16 + 1;
              } while (uVar13 != 0);
            }
            if (0xfffffff < uVar18) {
              fVar19 = fVar19 / (float)(uVar18 >> 0x1c);
            }
            pMVar11 = Mio_GateReadPins(pMVar8);
            fVar20 = 0.0;
            for (; pMVar11 != (Mio_Pin_t *)0x0; pMVar11 = Mio_PinReadNext(pMVar11)) {
              fVar20 = fVar20 + (float)(pMVar11->dDelayBlockRise * 0.5 +
                                       pMVar11->dDelayBlockFall * 0.5);
            }
            if (pMVar8->nInputs != 0) {
              fVar20 = fVar20 / (float)pMVar8->nInputs;
            }
            if (fVar19 <= fVar20 + 0.0094636) {
              if (fVar20 + -0.0094636 <= fVar19) {
                iVar6 = strcmp(pMVar9->pName,pMVar8->pName);
                if (0 < iVar6) goto LAB_003ddfc9;
                if (-1 < iVar6) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                                ,0x1fe,"int Mio_CompareTwo(Mio_Cell_t *, Mio_Gate_t *)");
                }
              }
              goto LAB_003dddfa;
            }
LAB_003ddfc9:
            pMVar9->pName = pMVar8->pName;
            pMVar9->uTruth = (word)pMVar8->field_15;
            pMVar9->Area = (float)pMVar8->dArea;
            *(uint *)&pMVar9->field_0x8 =
                 *(uint *)&pMVar9->field_0x8 & 0xfffffff | pMVar8->nInputs << 0x1c;
            for (pMVar11 = pMVar8->pPins; pMVar11 != (Mio_Pin_t *)0x0; pMVar11 = pMVar11->pNext) {
              *pfVar10 = (float)(pMVar11->dDelayBlockRise * 0.5 + pMVar11->dDelayBlockFall * 0.5);
              pfVar10 = pfVar10 + 1;
            }
          }
          goto LAB_003dddfa;
        }
LAB_003dde52:
        wVar4 = (pMVar8->field_15).uTruth;
        if (wVar4 + 1 < 2) {
          if (pMVar8->nInputs != 0) {
            __assert_fail("pGate->nInputs == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x227,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)"
                         );
          }
          uVar13 = (ulong)((uint)(wVar4 == 0xffffffffffffffff) * 0x30);
          *(char **)((long)pMVar7->Delays + (uVar13 - 0x18)) = pMVar8->pName;
          *(anon_union_8_2_ab88de1c_for_Mio_GateStruct_t__15 *)((long)pMVar7->Delays + (uVar13 - 8))
               = pMVar8->field_15;
          *(float *)((long)pMVar7->Delays + (uVar13 - 0xc)) = (float)pMVar8->dArea;
          pbVar2 = (byte *)((long)pMVar7->Delays + (uVar13 - 0xd));
          *pbVar2 = *pbVar2 & 0xf;
          pMVar11 = pMVar8->pPins;
          if (pMVar11 != (Mio_Pin_t *)0x0) {
            pfVar10 = (float *)((long)pMVar7->Delays + uVar13);
            do {
              *pfVar10 = (float)(pMVar11->dDelayBlockRise * 0.5 + pMVar11->dDelayBlockFall * 0.5);
              pMVar11 = pMVar11->pNext;
              pfVar10 = pfVar10 + 1;
            } while (pMVar11 != (Mio_Pin_t *)0x0);
          }
        }
        else if ((wVar4 == 0xaaaaaaaaaaaaaaaa) || (wVar4 == 0x5555555555555555)) {
          if (pMVar8->nInputs != 1) {
            __assert_fail("pGate->nInputs == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x22e,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)"
                         );
          }
          pMVar9 = pMVar7 + 2;
          if (wVar4 == 0x5555555555555555) {
            pMVar9 = pMVar7 + 3;
          }
          pMVar9->pName = pMVar8->pName;
          pMVar9->uTruth = (word)pMVar8->field_15;
          pMVar9->Area = (float)pMVar8->dArea;
          *(uint *)&pMVar9->field_0x8 = *(uint *)&pMVar9->field_0x8 & 0xfffffff | 0x10000000;
          pMVar11 = pMVar8->pPins;
          if (pMVar11 != (Mio_Pin_t *)0x0) {
            pfVar10 = pMVar9->Delays;
            do {
              *pfVar10 = (float)(pMVar11->dDelayBlockRise * 0.5 + pMVar11->dDelayBlockFall * 0.5);
              pMVar11 = pMVar11->pNext;
              pfVar10 = pfVar10 + 1;
            } while (pMVar11 != (Mio_Pin_t *)0x0);
          }
        }
        else {
          pMVar7[(int)uVar18].pName = pMVar8->pName;
          pMVar7[(int)uVar18].uTruth = (word)pMVar8->field_15;
          pMVar7[(int)uVar18].Area = (float)pMVar8->dArea;
          *(uint *)&pMVar7[(int)uVar18].field_0x8 =
               *(uint *)&pMVar7[(int)uVar18].field_0x8 & 0xfffffff | pMVar8->nInputs << 0x1c;
          pMVar11 = pMVar8->pPins;
          uVar3 = uVar18 + 1;
          if (pMVar11 != (Mio_Pin_t *)0x0) {
            pfVar10 = pMVar7[(int)uVar18].Delays;
            do {
              *pfVar10 = (float)(pMVar11->dDelayBlockRise * 0.5 + pMVar11->dDelayBlockFall * 0.5);
              pMVar11 = pMVar11->pNext;
              pfVar10 = pfVar10 + 1;
            } while (pMVar11 != (Mio_Pin_t *)0x0);
          }
        }
      }
LAB_003dddfa:
      uVar18 = uVar3;
      pMVar8 = Mio_GateReadNext(pMVar8);
    } while (pMVar8 != (Mio_Gate_t *)0x0);
  }
  if (pMVar7->pName == (char *)0x0) {
    __s = "Error: Cannot find constant 0 gate in the library.";
  }
  else if (pMVar7[1].pName == (char *)0x0) {
    __s = "Error: Cannot find constant 1 gate in the library.";
  }
  else if (pMVar7[2].pName == (char *)0x0) {
    __s = "Error: Cannot find buffer gate in the library.";
  }
  else {
    if (pMVar7[3].pName != (char *)0x0) {
      uVar13 = (ulong)uVar18;
      if (5 < (int)uVar18) {
        qsort(pMVar7 + 4,(ulong)(uVar18 - 4),0x30,Mio_AreaCompare);
        iVar6 = Mio_AreaCompare(pMVar7 + 4,pMVar7 + (uVar13 - 1));
        if (0 < iVar6) {
          __assert_fail("Mio_AreaCompare( ppCells + 4, ppCells + iCell - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x241,"Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)");
        }
      }
      if (0 < (int)uVar18) {
        puVar12 = (uint *)&pMVar7->field_0x8;
        uVar14 = 0;
        do {
          uVar3 = (uint)uVar14 & 0xfffffff;
          if (*(long *)(puVar12 + -2) == 0) {
            uVar3 = 0xfffffff;
          }
          *puVar12 = *puVar12 & 0xf0000000 | uVar3;
          uVar14 = uVar14 + 1;
          puVar12 = puVar12 + 0xc;
        } while (uVar13 != uVar14);
      }
      if (fVerbose != 0) {
        __ptr = calloc((long)(iVar5 + 4),4);
        pMVar8 = Mio_LibraryReadGates(pLib);
        if (pMVar8 != (Mio_Gate_t *)0x0) {
          do {
            if ((pMVar8->nInputs <= nInputs) && (pMVar8->pTwin == (Mio_Gate_t *)0x0)) {
              if ((int)uVar18 < 1) {
LAB_003de429:
                __assert_fail("i < iCell",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                              ,0x256,
                              "Mio_Cell_t *Mio_CollectRootsNew(Mio_Library_t *, int, int *, int)");
              }
              uVar14 = 0;
              pwVar17 = &pMVar7->uTruth;
              while ((((Mio_Cell_t *)(pwVar17 + -2))->pName == (char *)0x0 ||
                     (*pwVar17 != (pMVar8->field_15).uTruth))) {
                uVar14 = uVar14 + 1;
                pwVar17 = pwVar17 + 6;
                if (uVar13 == uVar14) goto LAB_003de429;
              }
              piVar1 = (int *)((long)__ptr + uVar14 * 4);
              *piVar1 = *piVar1 + 1;
            }
            pMVar8 = Mio_GateReadNext(pMVar8);
          } while (pMVar8 != (Mio_Gate_t *)0x0);
        }
        if (0 < (int)uVar18) {
          pfVar10 = pMVar7->Delays;
          uVar14 = 0;
          do {
            printf("%4d : ",uVar14 & 0xffffffff);
            if (pMVar7[uVar14].pName == (char *)0x0) {
              puts("None");
            }
            else {
              uVar3 = *(uint *)&pMVar7[uVar14].field_0x8;
              fVar19 = 0.0;
              if (0xfffffff < uVar3) {
                uVar15 = 0;
                do {
                  fVar19 = fVar19 + pfVar10[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar3 >> 0x1c != uVar15);
              }
              if (0xfffffff < uVar3) {
                fVar19 = fVar19 / (float)(uVar3 >> 0x1c);
              }
              printf("%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n",
                     (double)pMVar7[uVar14].Area,(double)fVar19);
            }
            uVar14 = uVar14 + 1;
            pfVar10 = pfVar10 + 0xc;
          } while (uVar14 != uVar13);
        }
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      if (pnGates == (int *)0x0) {
        return pMVar7;
      }
      *pnGates = uVar18;
      return pMVar7;
    }
    __s = "Error: Cannot find inverter gate in the library.";
  }
  puts(__s);
  return (Mio_Cell_t *)0x0;
LAB_003dde46:
  uVar13 = uVar13 + 1;
  pfVar10 = pfVar10 + 0xc;
  if (uVar13 == uVar18) goto LAB_003dde52;
  goto LAB_003dde26;
}

Assistant:

Mio_Cell_t * Mio_CollectRootsNew( Mio_Library_t * pLib, int nInputs, int * pnGates, int fVerbose )
{
    Mio_Gate_t * pGate;
    Mio_Cell_t * ppCells;
    int i, nGates, iCell = 4;
    nGates = Mio_LibraryReadGateNum( pLib );
    ppCells = ABC_CALLOC( Mio_Cell_t, nGates + 4 );
    // for each functionality, select gate with the smallest area
    // if equal areas, select gate with smaller average pin delay
    // if these are also equal, select lexicographically smaller name
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( pGate->nInputs > nInputs || pGate->pTwin ) // skip large and multi-output
            continue;
        // check if the gate with this functionality already exists
        for ( i = 0; i < iCell; i++ )
            if ( ppCells[i].pName && ppCells[i].uTruth == pGate->uTruth )
            {
                if ( Mio_CompareTwo( ppCells + i, pGate ) )
                    Mio_CollectCopy( ppCells + i, pGate );
                break;
            }
        if ( i < iCell )
            continue;
        if ( pGate->uTruth == 0 || pGate->uTruth == ~(word)0 )
        {
            int Idx = (int)(pGate->uTruth == ~(word)0);
            assert( pGate->nInputs == 0 );
            Mio_CollectCopy( ppCells + Idx, pGate );
            continue;
        }
        if ( pGate->uTruth == ABC_CONST(0xAAAAAAAAAAAAAAAA) || pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA) )
        {
            int Idx = 2 + (int)(pGate->uTruth == ~ABC_CONST(0xAAAAAAAAAAAAAAAA));
            assert( pGate->nInputs == 1 );
            Mio_CollectCopy( ppCells + Idx, pGate );
            continue;
        }
        Mio_CollectCopy( ppCells + iCell++, pGate );
    }
    if ( ppCells[0].pName == NULL )
        { printf( "Error: Cannot find constant 0 gate in the library.\n" ); return NULL; }
    if ( ppCells[1].pName == NULL )
        { printf( "Error: Cannot find constant 1 gate in the library.\n" ); return NULL; }
    if ( ppCells[2].pName == NULL )
        { printf( "Error: Cannot find buffer gate in the library.\n" );     return NULL; }
    if ( ppCells[3].pName == NULL )
        { printf( "Error: Cannot find inverter gate in the library.\n" );   return NULL; }
    // sort by delay
    if ( iCell > 5 ) 
    {
        qsort( (void *)(ppCells + 4), (size_t)(iCell - 4), sizeof(Mio_Cell_t), 
                (int (*)(const void *, const void *)) Mio_AreaCompare );
        assert( Mio_AreaCompare( ppCells + 4, ppCells + iCell - 1 ) <= 0 );
    }
    // assign IDs
    for ( i = 0; i < iCell; i++ )
        ppCells[i].Id = ppCells[i].pName ? i : -1;

    // report
    if ( fVerbose )
    {
        // count gates
        int * pCounts = ABC_CALLOC( int, nGates + 4 );
        Mio_LibraryForEachGate( pLib, pGate )
        {
            if ( pGate->nInputs > nInputs || pGate->pTwin ) // skip large and multi-output
                continue;
            for ( i = 0; i < iCell; i++ )
                if ( ppCells[i].pName && ppCells[i].uTruth == pGate->uTruth )
                {
                    pCounts[i]++;
                    break;
                }
            assert( i < iCell );
        }
        for ( i = 0; i < iCell; i++ )
        {
            Mio_Cell_t * pCell = ppCells + i;
            printf( "%4d : ", i );
            if ( pCell->pName == NULL )
                printf( "None\n" );
            else
                printf( "%-20s   In = %d   N = %3d   A = %12.6f   D = %12.6f\n", 
                    pCell->pName, pCell->nFanins, pCounts[i], pCell->Area, Mio_CellDelayAve(pCell) );
        }
        ABC_FREE( pCounts );
    }
    if ( pnGates )
        *pnGates = iCell;
    return ppCells;
}